

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::Context::clearFilters(Context *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pvVar3;
  ulong uVar4;
  pointer pSVar5;
  ulong uVar6;
  
  pvVar3 = (this->p->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->p->filters).
      super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    uVar6 = 0;
    do {
      pSVar1 = pvVar3[uVar6].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar2 = pvVar3[uVar6].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pSVar5 = pSVar1;
      if (pSVar2 != pSVar1) {
        do {
          free(pSVar5->m_str);
          pSVar5 = pSVar5 + 1;
        } while (pSVar5 != pSVar2);
        pvVar3[uVar6].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar1;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      pvVar3 = (this->p->filters).
               super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->p->filters).
                     super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  return;
}

Assistant:

void Context::clearFilters() {
    for(unsigned i = 0; i < p->filters.size(); ++i)
        p->filters[i].clear();
}